

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O2

void mouseMotionCallback(GLFWwindow *window,double x,double y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ImGuiIO *pIVar6;
  float_t fVar7;
  float fVar8;
  vec3 vVar9;
  mat3 local_98;
  vec3 local_70;
  mat3 axis;
  mat3 local_3c;
  
  dVar1 = x - mouseMotionCallback::x0;
  dVar2 = y - mouseMotionCallback::y0;
  pIVar6 = ImGui::GetIO();
  dVar3 = mouseMotionCallback::x0;
  dVar4 = mouseMotionCallback::y0;
  if (pIVar6->WantCaptureMouse == false) {
    iVar5 = glfwGetMouseButton(window,0);
    if (iVar5 == 1) {
      dja::transpose(&g_camera.axis);
      local_70.x = 0.0;
      local_70.y = 0.0;
      local_70.z = 1.0;
      dja::mat3::rotation(&local_3c,&local_70,(float)(dVar1 * 0.005));
      dja::operator*(&local_98,&local_3c,&g_camera.axis);
      g_camera.axis.m[2].z = local_98.m[2].z;
      g_camera.axis.m[1].y = local_98.m[1].y;
      g_camera.axis.m[1].z = local_98.m[1].z;
      g_camera.axis.m[2].x = local_98.m[2].x;
      g_camera.axis.m[2].y = local_98.m[2].y;
      g_camera.axis.m[0].x = local_98.m[0].x;
      g_camera.axis.m[0].y = local_98.m[0].y;
      g_camera.axis.m[0].z = local_98.m[0].z;
      g_camera.axis.m[1].x = local_98.m[1].x;
      dja::mat3::rotation(&local_3c,axis.m + 1,(float)(dVar2 * 0.005));
      dja::operator*(&local_98,&local_3c,&g_camera.axis);
      g_camera.axis.m[2].z = local_98.m[2].z;
      g_camera.axis.m[1].y = local_98.m[1].y;
      g_camera.axis.m[1].z = local_98.m[1].z;
      g_camera.axis.m[2].x = local_98.m[2].x;
      g_camera.axis.m[2].y = local_98.m[2].y;
      g_camera.axis.m[0].x = local_98.m[0].x;
      g_camera.axis.m[0].y = local_98.m[0].y;
      g_camera.axis.m[0].z = local_98.m[0].z;
      g_camera.axis.m[1].x = local_98.m[1].x;
      vVar9 = dja::normalize(g_camera.axis.m);
      g_camera.axis.m[0].z = vVar9.z;
      g_camera.axis.m[0]._0_8_ = vVar9._0_8_;
      vVar9 = dja::normalize(g_camera.axis.m + 1);
      g_camera.axis.m[1].z = vVar9.z;
      g_camera.axis.m[1].x = vVar9.x;
      g_camera.axis.m[1].y = vVar9.y;
      vVar9 = dja::normalize(g_camera.axis.m + 2);
      g_camera.axis.m[2].z = vVar9.z;
      g_camera.axis.m[2]._0_8_ = vVar9._0_8_;
      dVar3 = x;
      dVar4 = y;
    }
    else {
      iVar5 = glfwGetMouseButton(window,1);
      dVar3 = x;
      dVar4 = y;
      if (iVar5 == 1) {
        dja::transpose(&g_camera.axis);
        fVar8 = (float)dVar1;
        fVar7 = dja::norm(&g_camera.pos);
        local_98.m[0].z = axis.m[1].z * fVar8 * 0.005 * fVar7;
        local_98.m[0].y = fVar7 * fVar8 * axis.m[1].y * 0.005;
        local_98.m[0].x = fVar7 * fVar8 * axis.m[1].x * 0.005;
        dja::operator-=(&g_camera.pos,local_98.m);
        fVar8 = (float)dVar2;
        fVar7 = dja::norm(&g_camera.pos);
        local_98.m[0].z = axis.m[2].z * fVar8 * 0.005 * fVar7;
        local_98.m[0].y = fVar7 * fVar8 * axis.m[2].y * 0.005;
        local_98.m[0].x = fVar7 * fVar8 * axis.m[2].x * 0.005;
        dja::operator+=(&g_camera.pos,local_98.m);
        dVar3 = x;
        dVar4 = y;
      }
    }
  }
  mouseMotionCallback::y0 = dVar4;
  mouseMotionCallback::x0 = dVar3;
  return;
}

Assistant:

void mouseMotionCallback(GLFWwindow* window, double x, double y)
{
    static double x0 = 0, y0 = 0;
    double dx = x - x0,
           dy = y - y0;

    ImGuiIO& io = ImGui::GetIO();
    if (io.WantCaptureMouse)
        return;

    if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) == GLFW_PRESS) {
        dja::mat3 axis = dja::transpose(g_camera.axis);
        g_camera.axis = dja::mat3::rotation(dja::vec3(0, 0, 1), dx * 5e-3)
                      * g_camera.axis;
        g_camera.axis = dja::mat3::rotation(axis[1], dy * 5e-3)
                      * g_camera.axis;
        g_camera.axis[0] = dja::normalize(g_camera.axis[0]);
        g_camera.axis[1] = dja::normalize(g_camera.axis[1]);
        g_camera.axis[2] = dja::normalize(g_camera.axis[2]);
    } else if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_RIGHT) == GLFW_PRESS) {
        dja::mat3 axis = dja::transpose(g_camera.axis);
        g_camera.pos-= axis[1] * dx * 5e-3 * norm(g_camera.pos);
        g_camera.pos+= axis[2] * dy * 5e-3 * norm(g_camera.pos);
    }

    x0 = x;
    y0 = y;
}